

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void print_setup_header(OSQPWorkspace *work)

{
  OSQPData *pOVar1;
  OSQPSettings *pOVar2;
  c_int cVar3;
  c_int cVar4;
  char *pcVar5;
  char local_78 [72];
  
  pOVar1 = work->data;
  pOVar2 = work->settings;
  cVar3 = pOVar1->A->p[pOVar1->A->n];
  cVar4 = pOVar1->P->p[pOVar1->P->n];
  builtin_strncpy(local_78,"-----------------------------------------------------------------",0x42)
  ;
  puts(local_78);
  printf("           OSQP v%s  -  Operator Splitting QP Solver\n              (c) Bartolomeo Stellato,  Goran Banjac\n        University of Oxford  -  Stanford University 2019\n"
         ,"0.6.0");
  builtin_strncpy(local_78,"-----------------------------------------------------------------",0x42)
  ;
  puts(local_78);
  printf("problem:  ");
  printf("variables n = %i, constraints m = %i\n          ",(ulong)(uint)pOVar1->n,
         (ulong)(uint)pOVar1->m);
  printf("nnz(P) + nnz(A) = %i\n",(ulong)(uint)((int)cVar3 + (int)cVar4));
  printf("settings: ");
  printf("linear system solver = %s",LINSYS_SOLVER_NAME[pOVar2->linsys_solver]);
  if (work->linsys_solver->nthreads != 1) {
    printf(" (%d threads)");
  }
  printf(",\n          ");
  printf("eps_abs = %.1e, eps_rel = %.1e,\n          ",SUB84(pOVar2->eps_abs,0),pOVar2->eps_rel);
  printf("eps_prim_inf = %.1e, eps_dual_inf = %.1e,\n          ",SUB84(pOVar2->eps_prim_inf,0),
         pOVar2->eps_dual_inf);
  printf("rho = %.2e ",SUB84(pOVar2->rho,0));
  if (pOVar2->adaptive_rho != 0) {
    printf("(adaptive)");
  }
  printf(",\n          ");
  printf("sigma = %.2e, alpha = %.2f, ",SUB84(pOVar2->sigma,0));
  printf("max_iter = %i\n",(ulong)(uint)pOVar2->max_iter);
  if (pOVar2->check_termination == 0) {
    puts("          check_termination: off,");
  }
  else {
    printf("          check_termination: on (interval %i),\n");
  }
  if ((pOVar2->time_limit != 0.0) || (NAN(pOVar2->time_limit))) {
    printf("          time_limit: %.2e sec,\n");
  }
  pcVar5 = "          scaling: on, ";
  if (pOVar2->scaling == 0) {
    pcVar5 = "          scaling: off, ";
  }
  printf(pcVar5);
  pcVar5 = "scaled_termination: on";
  if (pOVar2->scaled_termination == 0) {
    pcVar5 = "scaled_termination: off";
  }
  puts(pcVar5);
  pcVar5 = "          warm start: on, ";
  if (pOVar2->warm_start == 0) {
    pcVar5 = "          warm start: off, ";
  }
  printf(pcVar5);
  pcVar5 = "polish: on, ";
  if (pOVar2->polish == 0) {
    pcVar5 = "polish: off, ";
  }
  printf(pcVar5);
  if ((pOVar2->time_limit != 0.0) || (NAN(pOVar2->time_limit))) {
    printf("time_limit: %.2e sec\n");
  }
  else {
    puts("time_limit: off");
  }
  putchar(10);
  return;
}

Assistant:

void print_setup_header(const OSQPWorkspace *work) {
  OSQPData *data;
  OSQPSettings *settings;
  c_int nnz; // Number of nonzeros in the problem

  data     = work->data;
  settings = work->settings;

  // Number of nonzeros
  nnz = data->P->p[data->P->n] + data->A->p[data->A->n];

  print_line();
  c_print("           OSQP v%s  -  Operator Splitting QP Solver\n"
          "              (c) Bartolomeo Stellato,  Goran Banjac\n"
          "        University of Oxford  -  Stanford University 2019\n",
          OSQP_VERSION);
  print_line();

  // Print variables and constraints
  c_print("problem:  ");
  c_print("variables n = %i, constraints m = %i\n          ",
                                    (int)data->n,
          (int)data->m);
  c_print("nnz(P) + nnz(A) = %i\n", (int)nnz);

  // Print Settings
  c_print("settings: ");
  c_print("linear system solver = %s",
          LINSYS_SOLVER_NAME[settings->linsys_solver]);

  if (work->linsys_solver->nthreads != 1) {
    c_print(" (%d threads)", (int)work->linsys_solver->nthreads);
  }
  c_print(",\n          ");

  c_print("eps_abs = %.1e, eps_rel = %.1e,\n          ",
          settings->eps_abs, settings->eps_rel);
  c_print("eps_prim_inf = %.1e, eps_dual_inf = %.1e,\n          ",
          settings->eps_prim_inf, settings->eps_dual_inf);
  c_print("rho = %.2e ", settings->rho);

  if (settings->adaptive_rho) c_print("(adaptive)");
  c_print(",\n          ");
  c_print("sigma = %.2e, alpha = %.2f, ",
          settings->sigma, settings->alpha);
  c_print("max_iter = %i\n", (int)settings->max_iter);

  if (settings->check_termination) c_print(
      "          check_termination: on (interval %i),\n",
      (int)settings->check_termination);
  else c_print("          check_termination: off,\n");

# ifdef PROFILING
  if (settings->time_limit) c_print("          time_limit: %.2e sec,\n",
                                    settings->time_limit);
# endif /* ifdef PROFILING */

  if (settings->scaling) c_print("          scaling: on, ");
  else c_print("          scaling: off, ");

  if (settings->scaled_termination) c_print("scaled_termination: on\n");
  else c_print("scaled_termination: off\n");

  if (settings->warm_start) c_print("          warm start: on, ");
  else c_print("          warm start: off, ");

  if (settings->polish) c_print("polish: on, ");
  else c_print("polish: off, ");

  if (settings->time_limit) c_print("time_limit: %.2e sec\n", settings->time_limit);
  else c_print("time_limit: off\n");

  c_print("\n");
}